

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

void __thiscall internalJSONNode::internalJSONNode(internalJSONNode *this,internalJSONNode *orig)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  jsonChildren *pjVar3;
  size_t *psVar4;
  jsonChildren *pjVar5;
  JSONNode *item;
  JSONNode **ppJVar6;
  JSONNode **ppJVar7;
  size_type __dnew;
  size_type local_88;
  json_string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  json_string *local_58;
  json_string *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  json_string *local_38;
  
  this->_type = orig->_type;
  paVar1 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (orig->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_name,pcVar2,pcVar2 + (orig->_name)._M_string_length);
  this->_name_encoded = orig->_name_encoded;
  local_48 = &(this->_string).field_2;
  (this->_string)._M_dataplus._M_p = (pointer)local_48;
  pcVar2 = (orig->_string)._M_dataplus._M_p;
  local_40 = paVar1;
  local_38 = &this->_name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_string,pcVar2,pcVar2 + (orig->_string)._M_string_length);
  this->_string_encoded = orig->_string_encoded;
  this->_value = orig->_value;
  this->refcount = 1;
  this->fetched = orig->fetched;
  local_58 = &this->_comment;
  local_60 = &(this->_comment).field_2;
  (this->_comment)._M_dataplus._M_p = (pointer)local_60;
  pcVar2 = (orig->_comment)._M_dataplus._M_p;
  local_50 = &this->_string;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + (orig->_comment)._M_string_length);
  this->Children = (jsonChildren *)0x0;
  psVar4 = getCopyCtorCounter();
  *psVar4 = *psVar4 + 1;
  if ((this->_type & 0xfe) == 4) {
    pjVar5 = (jsonChildren *)operator_new(0x10);
    jsonChildren::jsonChildren(pjVar5);
    this->Children = pjVar5;
    pjVar5 = orig->Children;
    paVar1 = &local_80.field_2;
    local_88 = 0x16;
    local_80._M_dataplus._M_p = (pointer)paVar1;
    local_80._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_88);
    local_80.field_2._M_allocated_capacity = local_88;
    builtin_strncpy(local_80._M_dataplus._M_p,"Children is null empty",0x16);
    local_80._M_string_length = local_88;
    local_80._M_dataplus._M_p[local_88] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (pjVar5->mysize != 0) {
      pjVar5 = this->Children;
      pjVar3 = orig->Children;
      local_88 = 0x15;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      local_80._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_88);
      local_80.field_2._M_allocated_capacity = local_88;
      builtin_strncpy(local_80._M_dataplus._M_p,"Children is null size",0x15);
      local_80._M_string_length = local_88;
      local_80._M_dataplus._M_p[local_88] = '\0';
      JSONDebug::_JSON_ASSERT(true,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      jsonChildren::reserve(pjVar5,pjVar3->mysize);
      pjVar5 = orig->Children;
      local_88 = 0x16;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      local_80._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_88);
      local_80.field_2._M_allocated_capacity = local_88;
      builtin_strncpy(local_80._M_dataplus._M_p,"Children is null begin",0x16);
      local_80._M_string_length = local_88;
      local_80._M_dataplus._M_p[local_88] = '\0';
      JSONDebug::_JSON_ASSERT(true,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      ppJVar7 = pjVar5->array;
      pjVar5 = orig->Children;
      local_88 = 0x14;
      local_80._M_dataplus._M_p = (pointer)paVar1;
      local_80._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_88);
      local_80.field_2._M_allocated_capacity = local_88;
      builtin_strncpy(local_80._M_dataplus._M_p,"Children is null end",0x14);
      local_80._M_string_length = local_88;
      local_80._M_dataplus._M_p[local_88] = '\0';
      JSONDebug::_JSON_ASSERT(true,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar1) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      ppJVar6 = pjVar5->array + pjVar5->mysize;
      if (ppJVar7 != ppJVar6) {
        do {
          pjVar5 = this->Children;
          ::JSONNode::duplicate((JSONNode *)&local_80);
          item = ::JSONNode::newJSONNode((JSONNode *)&local_80);
          jsonChildren::push_back(pjVar5,item);
          if (local_80._M_dataplus._M_p != (char *)0x0) {
            ::JSONNode::decRef((JSONNode *)&local_80);
          }
          psVar4 = ::JSONNode::getDtorCounter();
          *psVar4 = *psVar4 + 1;
          ppJVar7 = ppJVar7 + 1;
        } while (ppJVar7 != ppJVar6);
      }
    }
  }
  return;
}

Assistant:

internalJSONNode::internalJSONNode(const internalJSONNode & orig) json_nothrow :
    _type(orig._type), _name(orig._name), _name_encoded(orig._name_encoded),
    _string(orig._string), _string_encoded(orig._string_encoded), _value(orig._value)
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(orig.fetched)
    initializeComment(orig._comment)
    initializeChildren(0){


    LIBJSON_COPY_CTOR;
    if (isContainer()){
	   CHILDREN = jsonChildren::newChildren();
	   if (json_likely(!orig.CHILDREN -> empty())){
		  CHILDREN -> reserve(orig.CHILDREN -> size());
		  json_foreach(orig.CHILDREN, myrunner){
			 CHILDREN -> push_back(JSONNode::newJSONNode((*myrunner) -> duplicate()));
		  }
	   }
    }
    #ifdef JSON_MUTEX_CALLBACKS /*-> JSON_MUTEX_CALLBACKS */
	   _set_mutex(orig.mylock, false);
    #endif /*<- */
}